

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::SerializeWithCachedSizes
          (NeuralNetworkClassifier *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  NeuralNetworkMultiArrayShapeMapping NVar3;
  NeuralNetworkImageShapeMapping NVar4;
  int size;
  NeuralNetworkLayer *value;
  NeuralNetworkPreprocessing *value_00;
  long lVar5;
  char *data;
  string *value_01;
  uint local_28;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NeuralNetworkClassifier *this_local;
  
  i_1 = 0;
  uVar2 = layers_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    value = layers(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  local_28 = 0;
  uVar2 = preprocessing_size(this);
  for (; local_28 < uVar2; local_28 = local_28 + 1) {
    value_00 = preprocessing(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value_00->super_MessageLite,output);
  }
  NVar3 = arrayinputshapemapping(this);
  if (NVar3 != RANK5_ARRAY_MAPPING) {
    NVar3 = arrayinputshapemapping(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(5,NVar3,output);
  }
  NVar4 = imageinputshapemapping(this);
  if (NVar4 != RANK5_IMAGE_MAPPING) {
    NVar4 = imageinputshapemapping(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(6,NVar4,output);
  }
  bVar1 = has_updateparams(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->updateparams_->super_MessageLite,output);
  }
  bVar1 = has_stringclasslabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  bVar1 = has_int64classlabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  labelprobabilitylayername_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    labelprobabilitylayername_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    labelprobabilitylayername_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,
               "CoreML.Specification.NeuralNetworkClassifier.labelProbabilityLayerName");
    value_01 = labelprobabilitylayername_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(200,value_01,output);
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->layers(i), output);
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  for (unsigned int i = 0, n = this->preprocessing_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->preprocessing(i), output);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->arrayinputshapemapping(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->imageinputshapemapping(), output);
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->updateparams_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // string labelProbabilityLayerName = 200;
  if (this->labelprobabilitylayername().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->labelprobabilitylayername().data(), this->labelprobabilitylayername().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NeuralNetworkClassifier.labelProbabilityLayerName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      200, this->labelprobabilitylayername(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkClassifier)
}